

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_test.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  shared_ptr<Thread> ptThread;
  vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_> vec;
  
  vec.super__Vector_base<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  vec.super__Vector_base<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  vec.super__Vector_base<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = 100;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    std::make_shared<Thread,void(&)()>((_func_void *)&ptThread);
    Thread::Start(ptThread.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>::push_back
              (&vec,&ptThread);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ptThread.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  for (lVar2 = 0; lVar2 != 0x640; lVar2 = lVar2 + 0x10) {
    Thread::Join(*(Thread **)
                  ((long)&((vec.
                            super__Vector_base<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + lVar2));
  }
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,globalVal);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>::~vector(&vec);
  return 0;
}

Assistant:

int main()
{
	vector<shared_ptr<Thread>> vec;
	for (int i = 0; i < 100; ++i)
	{
		shared_ptr<Thread> ptThread = make_shared<Thread> (addGlobal);
		ptThread->Start();
		vec.push_back(ptThread);
	}
	
	for (int i = 0; i < 100; ++i)
	{
		vec[i]->Join();
	}
	
	cout << globalVal << endl;
}